

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inttype.cpp
# Opt level: O3

void __thiscall IntegerType::IntegerType(IntegerType *this,ostream *os)

{
  undefined1 *puVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_00;
  initializer_list<Function> __l_01;
  char local_ed5 [9];
  OperatorChar local_ecc;
  OperatorChar local_ec8;
  OperatorChar local_ec4;
  OperatorChar local_ec0;
  OperatorChar local_ebc;
  OperatorChar local_eb8;
  OperatorChar local_eb4;
  OperatorChar local_eb0;
  OperatorChar local_eac;
  OperatorChar local_ea8;
  OperatorChar local_ea4;
  OperatorChar local_ea0;
  OperatorChar local_e9c [2];
  OperatorChar local_e96;
  OperatorChar local_e93;
  Function *local_e90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e88;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e80;
  _Any_data local_e78;
  code *local_e68;
  code *local_e60;
  string local_e58;
  _Any_data local_e38;
  code *local_e28;
  code *local_e20;
  _Any_data local_e18;
  code *local_e08;
  code *local_e00;
  string local_df8;
  string local_dd8;
  _Any_data local_db8;
  code *local_da8;
  code *local_da0;
  string local_d98;
  string local_d78;
  _Any_data local_d58;
  code *local_d48;
  code *local_d40;
  string local_d38;
  string local_d18;
  _Any_data local_cf8;
  code *local_ce8;
  code *local_ce0;
  string local_cd8;
  string local_cb8;
  _Any_data local_c98;
  code *local_c88;
  code *local_c80;
  string local_c78;
  string local_c58;
  _Any_data local_c38;
  code *local_c28;
  code *local_c20;
  string local_c18;
  string local_bf8;
  _Any_data local_bd8;
  code *local_bc8;
  code *local_bc0;
  string local_bb8;
  string local_b98;
  _Any_data local_b78;
  code *local_b68;
  code *local_b60;
  string local_b58;
  BinaryOperators *local_b38;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  Operator local_ab0;
  Operator local_a60;
  Operator local_a10;
  vector<Function,_std::allocator<Function>_> local_9c0;
  undefined1 local_9a8 [32];
  _Manager_type local_988;
  undefined1 local_978 [16];
  _Manager_type local_968;
  _Any_data local_938;
  code *local_928;
  code *local_920;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *local_8c0;
  _Any_data local_8b8;
  code *local_8a8;
  code *local_8a0;
  _Any_data local_898;
  code *local_888;
  code *local_880;
  _Any_data local_878;
  code *local_868;
  code *local_860;
  _Any_data local_858;
  code *local_848;
  code *local_840;
  _Any_data local_838;
  code *local_828;
  code *local_820;
  _Any_data local_818;
  code *local_808;
  code *local_800;
  _Any_data local_7f8;
  code *local_7e8;
  code *local_7e0;
  _Any_data local_7d8;
  code *local_7c8;
  code *local_7c0;
  _Any_data local_7b8;
  code *local_7a8;
  code *local_7a0;
  Operator local_798;
  Operator local_748;
  Operator local_6f8;
  Operator local_6a8;
  Operator local_658;
  Operator local_608;
  Operator local_5b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_568;
  undefined1 local_530 [112];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [128];
  undefined1 local_430 [96];
  undefined1 local_3d0 [88];
  undefined1 local_378 [88];
  OperatorChar local_320 [8];
  void *local_308;
  undefined8 uStack_300;
  _Manager_type local_2f8;
  _Invoker_type local_2f0;
  void *local_2e8;
  undefined8 uStack_2e0;
  _Manager_type local_2d8;
  _Invoker_type local_2d0;
  OperatorChar local_2c8 [8];
  undefined1 local_2b0 [128];
  undefined1 local_230 [112];
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [120];
  Function local_130;
  Function local_b0;
  
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__IntegerType_00147830;
  (this->mBinaryOperators)._M_h._M_buckets = &(this->mBinaryOperators)._M_h._M_single_bucket;
  (this->mBinaryOperators)._M_h._M_bucket_count = 1;
  (this->mBinaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBinaryOperators)._M_h._M_element_count = 0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBinaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e80 = &(this->mUnaryOperators)._M_h;
  (this->mUnaryOperators)._M_h._M_buckets = &(this->mUnaryOperators)._M_h._M_single_bucket;
  (this->mUnaryOperators)._M_h._M_bucket_count = 1;
  (this->mUnaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUnaryOperators)._M_h._M_element_count = 0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUnaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e88 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&this->mEnvironment;
  local_b38 = &this->mBinaryOperators;
  EnvironmentScope::EnvironmentScope((EnvironmentScope *)local_e88);
  local_ed5[8] = 0x5e;
  OperatorChar::OperatorChar(local_e9c,'^');
  local_7b8._8_8_ = 0;
  local_7a0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:18:65)>
              ::_M_invoke;
  local_7a8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:18:65)>
              ::_M_manager;
  local_7b8._M_unused._M_object = this;
  Operator::binary((Operator *)local_9a8,local_e9c[0],6,RIGHT,(BinaryOperatorFn *)&local_7b8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_530,local_ed5 + 8,(Operator *)local_9a8);
  local_ed5[7] = 0x2a;
  OperatorChar::OperatorChar(&local_ea0,'*');
  local_7d8._M_unused._M_object = (void *)0x0;
  local_7d8._8_8_ = 0;
  local_7c0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:21:64)>
              ::_M_invoke;
  local_7c8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:21:64)>
              ::_M_manager;
  Operator::binary(&local_ab0,local_ea0,5,LEFT,(BinaryOperatorFn *)&local_7d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_530 + 0x58),local_ed5 + 7,&local_ab0);
  local_ed5[6] = 0x2f;
  OperatorChar::OperatorChar(&local_ea4,'/');
  local_7f8._M_unused._M_object = (void *)0x0;
  local_7f8._8_8_ = 0;
  local_7e0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:24:64)>
              ::_M_invoke;
  local_7e8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:24:64)>
              ::_M_manager;
  Operator::binary(&local_798,local_ea4,5,LEFT,(BinaryOperatorFn *)&local_7f8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_4b0 + 0x30),local_ed5 + 6,&local_798);
  local_ed5[5] = 0x25;
  OperatorChar::OperatorChar(&local_ea8,'%');
  local_818._M_unused._M_object = (void *)0x0;
  local_818._8_8_ = 0;
  local_800 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:27:64)>
              ::_M_invoke;
  local_808 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:27:64)>
              ::_M_manager;
  Operator::binary(&local_748,local_ea8,5,LEFT,(BinaryOperatorFn *)&local_818);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_430 + 8),local_ed5 + 5,&local_748);
  local_ed5[4] = 0x2b;
  OperatorChar::OperatorChar(&local_eac,'+');
  local_838._M_unused._M_object = (void *)0x0;
  local_838._8_8_ = 0;
  local_820 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:30:64)>
              ::_M_invoke;
  local_828 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:30:64)>
              ::_M_manager;
  Operator::binary(&local_6f8,local_eac,4,LEFT,(BinaryOperatorFn *)&local_838);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_3d0,local_ed5 + 4,&local_6f8);
  local_ed5[3] = 0x2d;
  OperatorChar::OperatorChar(&local_eb0,'-');
  local_858._M_unused._M_object = (void *)0x0;
  local_858._8_8_ = 0;
  local_840 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:33:64)>
              ::_M_invoke;
  local_848 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:33:64)>
              ::_M_manager;
  Operator::binary(&local_5b8,local_eb0,4,LEFT,(BinaryOperatorFn *)&local_858);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_378,local_ed5 + 3,&local_5b8);
  OperatorChar::OperatorChar(&local_e93,'<','<');
  OperatorChar::OperatorChar(&local_eb4,'<','<');
  local_878._M_unused._M_object = (void *)0x0;
  local_878._8_8_ = 0;
  local_860 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:36:102)>
              ::_M_invoke;
  local_868 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:36:102)>
              ::_M_manager;
  Operator::binary(&local_a10,local_eb4,3,LEFT,(BinaryOperatorFn *)&local_878);
  local_320[0].mOp2 = local_e93.mOp2;
  local_320[0].mIsTwoChars = local_e93.mIsTwoChars;
  local_320[0].mOp1 = local_e93.mOp1;
  local_308 = (void *)0x0;
  uStack_300 = 0;
  local_2f8 = (_Manager_type)0x0;
  local_2f0 = local_a10.mBinaryFn._M_invoker;
  if (local_a10.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_308 = local_a10.mBinaryFn.super__Function_base._M_functor._M_unused._M_object;
    uStack_300 = local_a10.mBinaryFn.super__Function_base._M_functor._8_8_;
    local_2f8 = local_a10.mBinaryFn.super__Function_base._M_manager;
    local_a10.mBinaryFn.super__Function_base._M_manager = (_Manager_type)0x0;
    local_a10.mBinaryFn._M_invoker = (_Invoker_type)0x0;
  }
  local_2e8 = (void *)0x0;
  uStack_2e0 = 0;
  local_2d8 = (_Manager_type)0x0;
  local_2d0 = local_a10.mUnaryFn._M_invoker;
  if (local_a10.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_2e8 = local_a10.mUnaryFn.super__Function_base._M_functor._M_unused._M_object;
    uStack_2e0 = local_a10.mUnaryFn.super__Function_base._M_functor._8_8_;
    local_2d8 = local_a10.mUnaryFn.super__Function_base._M_manager;
    local_a10.mUnaryFn.super__Function_base._M_manager = (_Manager_type)0x0;
    local_a10.mUnaryFn._M_invoker = (_Invoker_type)0x0;
  }
  OperatorChar::OperatorChar(&local_e96,'>','>');
  OperatorChar::OperatorChar(&local_eb8,'>','>');
  local_898._M_unused._M_object = (void *)0x0;
  local_898._8_8_ = 0;
  local_880 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:39:102)>
              ::_M_invoke;
  local_888 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:39:102)>
              ::_M_manager;
  Operator::binary(&local_a60,local_eb8,3,LEFT,(BinaryOperatorFn *)&local_898);
  local_2c8[0].mOp2 = local_e96.mOp2;
  local_2c8[0].mIsTwoChars = local_e96.mIsTwoChars;
  local_2c8[0].mOp1 = local_e96.mOp1;
  local_e90 = (Function *)local_2b0;
  local_2b0._0_8_ = (pointer)0x0;
  local_2b0._8_8_ = 0;
  local_2b0._16_8_ = (_Manager_type)0x0;
  local_2b0._24_8_ = local_a60.mBinaryFn._M_invoker;
  if (local_a60.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_2b0._0_8_ = local_a60.mBinaryFn.super__Function_base._M_functor._M_unused._M_object;
    local_2b0._8_8_ = local_a60.mBinaryFn.super__Function_base._M_functor._8_8_;
    local_2b0._16_8_ = local_a60.mBinaryFn.super__Function_base._M_manager;
    local_a60.mBinaryFn.super__Function_base._M_manager = (_Manager_type)0x0;
    local_a60.mBinaryFn._M_invoker = (_Invoker_type)0x0;
  }
  local_2b0._32_8_ = (void *)0x0;
  local_2b0._40_8_ = 0;
  local_2b0._48_8_ = (_Manager_type)0x0;
  local_2b0._56_8_ = local_a60.mUnaryFn._M_invoker;
  if (local_a60.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_2b0._32_8_ = local_a60.mUnaryFn.super__Function_base._M_functor._M_unused._M_object;
    local_2b0._40_8_ = local_a60.mUnaryFn.super__Function_base._M_functor._8_8_;
    local_2b0._48_8_ = local_a60.mUnaryFn.super__Function_base._M_manager;
    local_a60.mUnaryFn.super__Function_base._M_manager = (_Manager_type)0x0;
    local_a60.mUnaryFn._M_invoker = (_Invoker_type)0x0;
  }
  local_ed5[2] = 0x7c;
  OperatorChar::OperatorChar(&local_ebc,'|');
  local_8b8._M_unused._M_object = (void *)0x0;
  local_8b8._8_8_ = 0;
  local_8a0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:42:64)>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:42:64)>
              ::_M_manager;
  Operator::binary(&local_608,local_ebc,2,LEFT,(BinaryOperatorFn *)&local_8b8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_2b0 + 0x40),local_ed5 + 2,&local_608);
  local_ed5[1] = 0x26;
  OperatorChar::OperatorChar(&local_ec0,'&');
  local_8d8._M_unused._M_object = (void *)0x0;
  local_8d8._8_8_ = 0;
  local_8c0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:45:64)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:45:64)>
              ::_M_manager;
  Operator::binary(&local_658,local_ec0,2,LEFT,(BinaryOperatorFn *)&local_8d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_230 + 0x18),local_ed5 + 1,&local_658);
  local_ed5[0] = '=';
  OperatorChar::OperatorChar(&local_ec4,'=');
  local_8f8._M_unused._M_object = (void *)0x0;
  local_8f8._8_8_ = 0;
  local_8e0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:48:65)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:48:65)>
              ::_M_manager;
  Operator::binary(&local_6a8,local_ec4,1,RIGHT,(BinaryOperatorFn *)&local_8f8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_1c0,local_ed5,&local_6a8);
  __l._M_len = 0xb;
  __l._M_array = (iterator)local_530;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->mBinaryOperators)._M_h,__l);
  lVar2 = -0x3c8;
  puVar1 = local_1a8;
  do {
    if (*(code **)(puVar1 + 0x30) != (code *)0x0) {
      (**(code **)(puVar1 + 0x30))(puVar1 + 0x20,puVar1 + 0x20,3);
    }
    if (*(code **)(puVar1 + 0x10) != (code *)0x0) {
      (**(code **)(puVar1 + 0x10))(puVar1,puVar1,3);
    }
    puVar1 = puVar1 + -0x58;
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0);
  if (local_6a8.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_6a8.mUnaryFn,(_Any_data *)&local_6a8.mUnaryFn,__destroy_functor);
  }
  if (local_6a8.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_6a8.mBinaryFn,(_Any_data *)&local_6a8.mBinaryFn,__destroy_functor
              );
  }
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,__destroy_functor);
  }
  if (local_658.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_658.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_658.mUnaryFn,(_Any_data *)&local_658.mUnaryFn,__destroy_functor);
  }
  if (local_658.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_658.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_658.mBinaryFn,(_Any_data *)&local_658.mBinaryFn,__destroy_functor
              );
  }
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,__destroy_functor);
  }
  if (local_608.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_608.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_608.mUnaryFn,(_Any_data *)&local_608.mUnaryFn,__destroy_functor);
  }
  if (local_608.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_608.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_608.mBinaryFn,(_Any_data *)&local_608.mBinaryFn,__destroy_functor
              );
  }
  if (local_8a8 != (code *)0x0) {
    (*local_8a8)(&local_8b8,&local_8b8,__destroy_functor);
  }
  if (local_a60.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a60.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_a60.mUnaryFn,(_Any_data *)&local_a60.mUnaryFn,__destroy_functor);
  }
  if (local_a60.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a60.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_a60.mBinaryFn,(_Any_data *)&local_a60.mBinaryFn,__destroy_functor
              );
  }
  if (local_888 != (code *)0x0) {
    (*local_888)(&local_898,&local_898,__destroy_functor);
  }
  if (local_a10.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a10.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_a10.mUnaryFn,(_Any_data *)&local_a10.mUnaryFn,__destroy_functor);
  }
  if (local_a10.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a10.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_a10.mBinaryFn,(_Any_data *)&local_a10.mBinaryFn,__destroy_functor
              );
  }
  if (local_868 != (code *)0x0) {
    (*local_868)(&local_878,&local_878,__destroy_functor);
  }
  if (local_5b8.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5b8.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_5b8.mUnaryFn,(_Any_data *)&local_5b8.mUnaryFn,__destroy_functor);
  }
  if (local_5b8.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5b8.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_5b8.mBinaryFn,(_Any_data *)&local_5b8.mBinaryFn,__destroy_functor
              );
  }
  if (local_848 != (code *)0x0) {
    (*local_848)(&local_858,&local_858,__destroy_functor);
  }
  if (local_6f8.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6f8.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_6f8.mUnaryFn,(_Any_data *)&local_6f8.mUnaryFn,__destroy_functor);
  }
  if (local_6f8.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6f8.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_6f8.mBinaryFn,(_Any_data *)&local_6f8.mBinaryFn,__destroy_functor
              );
  }
  if (local_828 != (code *)0x0) {
    (*local_828)(&local_838,&local_838,__destroy_functor);
  }
  if (local_748.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_748.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_748.mUnaryFn,(_Any_data *)&local_748.mUnaryFn,__destroy_functor);
  }
  if (local_748.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_748.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_748.mBinaryFn,(_Any_data *)&local_748.mBinaryFn,__destroy_functor
              );
  }
  if (local_808 != (code *)0x0) {
    (*local_808)(&local_818,&local_818,__destroy_functor);
  }
  if (local_798.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_798.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_798.mUnaryFn,(_Any_data *)&local_798.mUnaryFn,__destroy_functor);
  }
  if (local_798.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_798.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_798.mBinaryFn,(_Any_data *)&local_798.mBinaryFn,__destroy_functor
              );
  }
  if (local_7e8 != (code *)0x0) {
    (*local_7e8)(&local_7f8,&local_7f8,__destroy_functor);
  }
  if (local_ab0.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ab0.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_ab0.mUnaryFn,(_Any_data *)&local_ab0.mUnaryFn,__destroy_functor);
  }
  if (local_ab0.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ab0.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_ab0.mBinaryFn,(_Any_data *)&local_ab0.mBinaryFn,__destroy_functor
              );
  }
  if (local_7c8 != (code *)0x0) {
    (*local_7c8)(&local_7d8,&local_7d8,__destroy_functor);
  }
  if (local_968 != (_Manager_type)0x0) {
    (*local_968)((_Any_data *)local_978,(_Any_data *)local_978,__destroy_functor);
  }
  if (local_988 != (_Manager_type)0x0) {
    (*local_988)((_Any_data *)(local_9a8 + 0x10),(_Any_data *)(local_9a8 + 0x10),__destroy_functor);
  }
  if (local_7a8 != (code *)0x0) {
    (*local_7a8)(&local_7b8,&local_7b8,__destroy_functor);
  }
  local_798.mOp.mIsTwoChars = true;
  OperatorChar::OperatorChar(&local_ec8,'-');
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  local_900 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:54:63)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:54:63)>
              ::_M_manager;
  Operator::unary((Operator *)local_9a8,local_ec8,7,LEFT,(UnaryOperatorFn *)&local_918);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_530,(char *)&local_798,
             (Operator *)local_9a8);
  local_748.mOp.mIsTwoChars = true;
  OperatorChar::OperatorChar(&local_ecc,'~');
  local_938._M_unused._M_object = (void *)0x0;
  local_938._8_8_ = 0;
  local_920 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:57:63)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:57:63)>
              ::_M_manager;
  Operator::unary(&local_ab0,local_ecc,7,LEFT,(UnaryOperatorFn *)&local_938);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)(local_530 + 0x58),(char *)&local_748,&local_ab0)
  ;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_530;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(local_e80,__l_00);
  lVar2 = -0xb0;
  puVar1 = local_4c0;
  do {
    if (*(code **)(puVar1 + 0x30) != (code *)0x0) {
      (**(code **)(puVar1 + 0x30))(puVar1 + 0x20,puVar1 + 0x20,3);
    }
    if (*(code **)(puVar1 + 0x10) != (code *)0x0) {
      (**(code **)(puVar1 + 0x10))(puVar1,puVar1,3);
    }
    puVar1 = puVar1 + -0x58;
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0);
  if (local_ab0.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ab0.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_ab0.mUnaryFn,(_Any_data *)&local_ab0.mUnaryFn,__destroy_functor);
  }
  if (local_ab0.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ab0.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_ab0.mBinaryFn,(_Any_data *)&local_ab0.mBinaryFn,__destroy_functor
              );
  }
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,__destroy_functor);
  }
  if (local_968 != (_Manager_type)0x0) {
    (*local_968)((_Any_data *)local_978,(_Any_data *)local_978,__destroy_functor);
  }
  if (local_988 != (_Manager_type)0x0) {
    (*local_988)((_Any_data *)(local_9a8 + 0x10),(_Any_data *)(local_9a8 + 0x10),__destroy_functor);
  }
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,ResultValue>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_568,0,0,0,&local_ab0,&local_798,&local_748);
  local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"bitand","");
  local_b78._8_8_ = 0;
  local_b60 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:63:25)>
              ::_M_invoke;
  local_b68 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:63:25)>
              ::_M_manager;
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  local_b78._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b98,"Computes bitwise AND between x and y.","");
  Function::Function((Function *)local_530,&local_b58,2,(ExternalFunction *)&local_b78,&local_b98);
  local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb8,"bitor","");
  local_bd8._8_8_ = 0;
  local_bc0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:66:24)>
              ::_M_invoke;
  local_bc8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:66:24)>
              ::_M_manager;
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  local_bd8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bf8,"Computes bitwise OR between x and y.","");
  Function::Function((Function *)local_4b0,&local_bb8,2,(ExternalFunction *)&local_bd8,&local_bf8);
  local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c18,"bitxor","");
  local_c38._8_8_ = 0;
  local_c20 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:69:25)>
              ::_M_invoke;
  local_c28 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:69:25)>
              ::_M_manager;
  local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
  local_c38._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c58,"Computes bitwise XOR between x and y.","");
  Function::Function((Function *)local_430,&local_c18,2,(ExternalFunction *)&local_c38,&local_c58);
  local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"mod","");
  local_c98._8_8_ = 0;
  local_c80 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:72:22)>
              ::_M_invoke;
  local_c88 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:72:22)>
              ::_M_manager;
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  local_c98._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"Computes x mod y.","");
  Function::Function((Function *)(local_3d0 + 0x20),&local_c78,2,(ExternalFunction *)&local_c98,
                     &local_cb8);
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd8,"powerMod","");
  local_cf8._8_8_ = 0;
  local_ce0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:81:27)>
              ::_M_invoke;
  local_ce8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:81:27)>
              ::_M_manager;
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  local_cf8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"Computes x^y mod z.","");
  Function::Function((Function *)(local_378 + 0x48),&local_cd8,3,(ExternalFunction *)&local_cf8,
                     &local_d18);
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d38,"gcd","");
  local_d58._8_8_ = 0;
  local_d40 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:87:22)>
              ::_M_invoke;
  local_d48 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:87:22)>
              ::_M_manager;
  local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
  local_d58._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d78,"Computes the greatest common divisor between x and y.","");
  Function::Function((Function *)local_2b0,&local_d38,2,(ExternalFunction *)&local_d58,&local_d78);
  local_e90 = (Function *)local_230;
  local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d98,"modInv","");
  local_db8._8_8_ = 0;
  local_da0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:90:25)>
              ::_M_invoke;
  local_da8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:90:25)>
              ::_M_manager;
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  local_db8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_dd8,"Tries to find the multiplicative inverse of x mod y.","");
  Function::Function((Function *)local_230,&local_d98,2,(ExternalFunction *)&local_db8,&local_dd8);
  local_e90 = (Function *)(local_1c0 + 0x10);
  local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df8,"sqrt","");
  local_e18._8_8_ = 0;
  local_e00 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:101:23)>
              ::_M_invoke;
  local_e08 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:101:23)>
              ::_M_manager;
  local_e18._M_unused._M_object = this;
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,"Returns the integer part of the square root of x.","");
  Function::Function((Function *)(local_1c0 + 0x10),&local_df8,1,(ExternalFunction *)&local_e18,
                     &local_ad0);
  local_e90 = &local_130;
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"twocomp","");
  local_e20 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:108:26)>
              ::_M_invoke;
  local_e28 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:108:26)>
              ::_M_manager;
  local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
  local_e38._M_unused._M_object = this;
  local_e38._8_8_ = os;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e58,"Prints the given value in two-complements form.","");
  Function::Function(&local_130,&local_af0,1,(ExternalFunction *)&local_e38,&local_e58);
  local_e90 = &local_b0;
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"twocomp","");
  local_e60 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:112:26)>
              ::_M_invoke;
  local_e68 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/inttype.cpp:112:26)>
              ::_M_manager;
  local_e78._M_unused._M_object = this;
  local_e78._8_8_ = os;
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b30,"Prints the value x in two-complements form of size y.","");
  Function::Function(&local_b0,&local_b10,2,(ExternalFunction *)&local_e78,&local_b30);
  __l_01._M_len = 10;
  __l_01._M_array = (iterator)local_530;
  std::vector<Function,_std::allocator<Function>_>::vector
            (&local_9c0,__l_01,(allocator_type *)&local_6f8);
  EnvironmentScope::EnvironmentScope
            ((EnvironmentScope *)local_9a8,(Variables *)&local_568,&local_9c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(local_e88,local_9a8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->mEnvironment).mFunctions._M_h,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_978 + 8));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_978 + 8));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_9a8);
  std::vector<Function,_std::allocator<Function>_>::~vector(&local_9c0);
  lVar2 = -0x500;
  paVar3 = &local_b0.mInfoText.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(&paVar3->_M_allocated_capacity)[-3] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&paVar3->_M_allocated_capacity)[-3]);
    }
    if ((code *)(&paVar3->_M_allocated_capacity)[-6] != (code *)0x0) {
      (*(code *)(&paVar3->_M_allocated_capacity)[-6])
                (&paVar3->_M_allocated_capacity + -8,&paVar3->_M_allocated_capacity + -8,3);
    }
    if (&paVar3->_M_allocated_capacity + -0xc != (size_type *)(&paVar3->_M_allocated_capacity)[-0xe]
       ) {
      operator_delete((size_type *)(&paVar3->_M_allocated_capacity)[-0xe],
                      (&paVar3->_M_allocated_capacity)[-0xc] + 1);
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -0x10);
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
  }
  if (local_e68 != (code *)0x0) {
    (*local_e68)(&local_e78,&local_e78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
    operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
  }
  if (local_e28 != (code *)0x0) {
    (*local_e28)(&local_e38,&local_e38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
  }
  if (local_e08 != (code *)0x0) {
    (*local_e08)(&local_e18,&local_e18,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
  }
  if (local_da8 != (code *)0x0) {
    (*local_da8)(&local_db8,&local_db8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
    operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
  }
  if (local_d48 != (code *)0x0) {
    (*local_d48)(&local_d58,&local_d58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
  }
  if (local_ce8 != (code *)0x0) {
    (*local_ce8)(&local_cf8,&local_cf8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
  }
  if (local_c88 != (code *)0x0) {
    (*local_c88)(&local_c98,&local_c98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
    operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
    operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
  }
  if (local_c28 != (code *)0x0) {
    (*local_c28)(&local_c38,&local_c38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  if (local_bc8 != (code *)0x0) {
    (*local_bc8)(&local_bd8,&local_bd8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
    operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
  }
  if (local_b68 != (code *)0x0) {
    (*local_b68)(&local_b78,&local_b78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_568);
  return;
}

Assistant:

IntegerType::IntegerType(std::ostream& os) {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return power(lhs.intValue(), rhs.intValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() * rhs.intValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() / rhs.intValue();
		}) },
		{ '%', Operator::binary('%', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() % rhs.intValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() + rhs.intValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() - rhs.intValue();
		}) },
		{ OperatorChar('<', '<'), Operator::binary(OperatorChar('<', '<'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() << rhs.intValue();
		}) },
		{ OperatorChar('>', '>'), Operator::binary(OperatorChar('>', '>'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() >> rhs.intValue();
		}) },
		{ '|', Operator::binary('|', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() | rhs.intValue();
		}) },
		{ '&', Operator::binary('&', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() & rhs.intValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.intValue();
		}) },
		{ '~', Operator::unary('~', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return ~op.intValue();
		}) },
	};

	mEnvironment = EnvironmentScope(Variables({}), {
		Function("bitand", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise AND between x and y."),
		Function("bitor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() | args.at(1).intValue());
		}, "Computes bitwise OR between x and y."),
		Function("bitxor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise XOR between x and y."),
		Function("mod", 2, [this](FunctionArguments args) {
			std::int64_t result = args.at(0).intValue() % args.at(1).intValue();

			if (result < 0) {
				result += args.at(1).intValue();
			}

			return ResultValue(result);
		}, "Computes x mod y."),
		Function("powerMod", 3, [this](FunctionArguments args) {
			return ResultValue(
				powerMod(args.at(0).intValue(),
						 args.at(1).intValue(),
						 args.at(2).intValue()));
		}, "Computes x^y mod z."),
		Function("gcd", 2, [this](FunctionArguments args) {
			return ResultValue(gcd(args.at(0).intValue(), args.at(1).intValue()));
		}, "Computes the greatest common divisor between x and y."),
		Function("modInv", 2, [this](FunctionArguments args) {
			if (gcd(args[0].intValue(), args[1].intValue()) == 1) {
				return ResultValue(
					modularMultInverse(
						args.at(0).intValue(),
						args.at(1).intValue()));
			} else {
				throw std::runtime_error(
					std::to_string(args[0].intValue()) + " is not invertible mod " + std::to_string(args[1].intValue()) + ".");
			}
		}, "Tries to find the multiplicative inverse of x mod y."),
		Function("sqrt", 1, [this](FunctionArguments args) {
			if (args[0].intValue() >= 0) {
				return ResultValue(sqrt(args[0].intValue()));
			} else {
				throw std::runtime_error("The value must be >= 0.");
			}
		}, "Returns the integer part of the square root of x."),
		Function("twocomp", 1, [this, &os](FunctionArguments args) {
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue()) << std::endl;
			return ResultValue();
		}, "Prints the given value in two-complements form."),
		Function("twocomp", 2, [this, &os](FunctionArguments args) {
			int size = (int)args.at(1).intValue();
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue(), size) << std::endl;
			return ResultValue();
		}, "Prints the value x in two-complements form of size y."),
	});
}